

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadeFragments
          (InstancedExpansionShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  ulong uVar3;
  ulong uVar4;
  int fragNdx;
  long lVar5;
  
  pGVar2 = context->outputArray;
  iVar1 = context->numFragmentOutputs;
  uVar4 = 0;
  uVar3 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      *(undefined8 *)&pGVar2[(int)(((uint)lVar5 | (int)uVar4 * 4) * iVar1)].v = 0x3f8000003f800000;
      *(undefined8 *)((long)&pGVar2[(int)(((uint)lVar5 | (int)uVar4 * 4) * iVar1)].v + 8) =
           0x3f8000003f800000;
    }
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_UNREF(packets);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
}